

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O2

string * __thiscall
flatbuffers::go::GoGenerator::NativeType_abi_cxx11_
          (string *__return_storage_ptr__,GoGenerator *this,Type *type)

{
  EnumDef *def;
  StructDef *def_00;
  string *this_00;
  string local_60;
  undefined1 local_40 [32];
  
  if (type->base_type - BASE_TYPE_UTYPE < 0xc) {
    if (type->enum_def != (EnumDef *)0x0) {
      GetEnumTypeName_abi_cxx11_(__return_storage_ptr__,this,type->enum_def);
      return __return_storage_ptr__;
    }
    GenTypeBasic_abi_cxx11_(__return_storage_ptr__,this,type);
    return __return_storage_ptr__;
  }
  switch(type->base_type) {
  case BASE_TYPE_STRING:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"string",(allocator<char> *)&local_60);
    return __return_storage_ptr__;
  case BASE_TYPE_VECTOR:
  case BASE_TYPE_VECTOR64:
    local_40._0_4_ = type->element;
    local_40._24_2_ = type->fixed_length;
    local_40._4_4_ = BASE_TYPE_NONE;
    local_40._8_8_ = type->struct_def;
    local_40._16_8_ = type->enum_def;
    NativeType_abi_cxx11_(&local_60,this,(Type *)local_40);
    std::operator+(__return_storage_ptr__,"[]",&local_60);
    this_00 = &local_60;
    goto LAB_001a70bb;
  case BASE_TYPE_STRUCT:
    def_00 = type->struct_def;
    (*(this->namer_).super_Namer._vptr_Namer[0x11])((string *)local_40,&this->namer_,def_00);
    WrapInNameSpaceAndTrack(&local_60,this,&def_00->super_Definition,(string *)local_40);
    std::operator+(__return_storage_ptr__,"*",&local_60);
    break;
  case BASE_TYPE_UNION:
    def = type->enum_def;
    (*(this->namer_).super_Namer._vptr_Namer[0x11])((string *)local_40,&this->namer_,def);
    WrapInNameSpaceAndTrack(&local_60,this,&def->super_Definition,(string *)local_40);
    std::operator+(__return_storage_ptr__,"*",&local_60);
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_go.cpp"
                  ,0x5e5,"std::string flatbuffers::go::GoGenerator::NativeType(const Type &)");
  }
  std::__cxx11::string::~string((string *)&local_60);
  this_00 = (string *)local_40;
LAB_001a70bb:
  std::__cxx11::string::~string((string *)this_00);
  return __return_storage_ptr__;
}

Assistant:

std::string NativeType(const Type &type) {
    if (IsScalar(type.base_type)) {
      if (type.enum_def == nullptr) {
        return GenTypeBasic(type);
      } else {
        return GetEnumTypeName(*type.enum_def);
      }
    } else if (IsString(type)) {
      return "string";
    } else if (IsVector(type)) {
      return "[]" + NativeType(type.VectorType());
    } else if (type.base_type == BASE_TYPE_STRUCT) {
      return "*" + WrapInNameSpaceAndTrack(type.struct_def,
                                           NativeName(*type.struct_def));
    } else if (type.base_type == BASE_TYPE_UNION) {
      return "*" +
             WrapInNameSpaceAndTrack(type.enum_def, NativeName(*type.enum_def));
    }
    FLATBUFFERS_ASSERT(0);
    return std::string();
  }